

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDebug.cpp
# Opt level: O3

char * VulkanUtilities::VkObjectTypeToString(VkObjectType ObjectType)

{
  char *pcVar1;
  
  pcVar1 = "unknown";
  if ((int)ObjectType < 1000000000) {
    switch(ObjectType) {
    case VK_OBJECT_TYPE_INSTANCE:
      return "instance";
    case VK_OBJECT_TYPE_PHYSICAL_DEVICE:
      return "physical device";
    case VK_OBJECT_TYPE_DEVICE:
      return "device";
    case VK_OBJECT_TYPE_QUEUE:
      return "queue";
    case VK_OBJECT_TYPE_SEMAPHORE:
      return "semaphore";
    case VK_OBJECT_TYPE_COMMAND_BUFFER:
      return "cmd buffer";
    case VK_OBJECT_TYPE_FENCE:
      return "fence";
    case VK_OBJECT_TYPE_DEVICE_MEMORY:
      return "memory";
    case VK_OBJECT_TYPE_BUFFER:
      return "buffer";
    case VK_OBJECT_TYPE_IMAGE:
      return "image";
    case VK_OBJECT_TYPE_EVENT:
      return "event";
    case VK_OBJECT_TYPE_QUERY_POOL:
      return "query pool";
    case VK_OBJECT_TYPE_BUFFER_VIEW:
      return "buffer view";
    case VK_OBJECT_TYPE_IMAGE_VIEW:
      return "image view";
    case VK_OBJECT_TYPE_SHADER_MODULE:
      return "shader module";
    case VK_OBJECT_TYPE_PIPELINE_CACHE:
      return "pipeline cache";
    case VK_OBJECT_TYPE_PIPELINE_LAYOUT:
      return "pipeline layout";
    case VK_OBJECT_TYPE_RENDER_PASS:
      return "render pass";
    case VK_OBJECT_TYPE_PIPELINE:
      return "pipeline";
    case VK_OBJECT_TYPE_DESCRIPTOR_SET_LAYOUT:
      return "descriptor set layout";
    case VK_OBJECT_TYPE_SAMPLER:
      return "sampler";
    case VK_OBJECT_TYPE_DESCRIPTOR_POOL:
      return "descriptor pool";
    case VK_OBJECT_TYPE_DESCRIPTOR_SET:
      return "descriptor set";
    case VK_OBJECT_TYPE_FRAMEBUFFER:
      return "framebuffer";
    case VK_OBJECT_TYPE_COMMAND_POOL:
      return "command pool";
    }
  }
  else if ((int)ObjectType < 0x3b9d13f0) {
    if ((int)ObjectType < 0x3b9ad1d1) {
      if (ObjectType == VK_OBJECT_TYPE_SURFACE_KHR) {
        return "surface KHR";
      }
      if (ObjectType == VK_OBJECT_TYPE_SWAPCHAIN_KHR) {
        return "swapchain KHR";
      }
      if (ObjectType == VK_OBJECT_TYPE_DISPLAY_KHR) {
        return "display KHR";
      }
    }
    else if ((int)ObjectType < 0x3b9c1608) {
      if (ObjectType == VK_OBJECT_TYPE_DISPLAY_MODE_KHR) {
        return "display mode KHR";
      }
      if (ObjectType == VK_OBJECT_TYPE_DEBUG_REPORT_CALLBACK_EXT) {
        return "debug report callback";
      }
    }
    else {
      if (ObjectType == VK_OBJECT_TYPE_DESCRIPTOR_UPDATE_TEMPLATE) {
        return "descriptor update template";
      }
      if (ObjectType == VK_OBJECT_TYPE_DEBUG_UTILS_MESSENGER_EXT) {
        return "debug utils messenger";
      }
    }
  }
  else if ((int)ObjectType < 0x3b9dfe50) {
    if (ObjectType == VK_OBJECT_TYPE_ACCELERATION_STRUCTURE_KHR) {
      return "acceleration structure KHR";
    }
    if (ObjectType == VK_OBJECT_TYPE_SAMPLER_YCBCR_CONVERSION) {
      return "sampler ycbcr conversion";
    }
    if (ObjectType == VK_OBJECT_TYPE_VALIDATION_CACHE_EXT) {
      return "validation cache EXT";
    }
  }
  else if ((int)ObjectType < 0x3b9f0408) {
    if (ObjectType == VK_OBJECT_TYPE_PERFORMANCE_CONFIGURATION_INTEL) {
      return "performance configuration INTEL";
    }
    if (ObjectType == VK_OBJECT_TYPE_DEFERRED_OPERATION_KHR) {
      return "deferred operation KHR";
    }
  }
  else if (ObjectType == VK_OBJECT_TYPE_INDIRECT_COMMANDS_LAYOUT_NV) {
    pcVar1 = "indirect commands layout NV";
  }
  else if (ObjectType == VK_OBJECT_TYPE_PRIVATE_DATA_SLOT) {
    return "private data slot EXT";
  }
  return pcVar1;
}

Assistant:

const char* VkObjectTypeToString(VkObjectType ObjectType)
{
    switch (ObjectType)
    {
        // clang-format off
        case VK_OBJECT_TYPE_UNKNOWN:                        return "unknown";
        case VK_OBJECT_TYPE_INSTANCE:                       return "instance";
        case VK_OBJECT_TYPE_PHYSICAL_DEVICE:                return "physical device";
        case VK_OBJECT_TYPE_DEVICE:                         return "device";
        case VK_OBJECT_TYPE_QUEUE:                          return "queue";
        case VK_OBJECT_TYPE_SEMAPHORE:                      return "semaphore";
        case VK_OBJECT_TYPE_COMMAND_BUFFER:                 return "cmd buffer";
        case VK_OBJECT_TYPE_FENCE:                          return "fence";
        case VK_OBJECT_TYPE_DEVICE_MEMORY:                  return "memory";
        case VK_OBJECT_TYPE_BUFFER:                         return "buffer";
        case VK_OBJECT_TYPE_IMAGE:                          return "image";
        case VK_OBJECT_TYPE_EVENT:                          return "event";
        case VK_OBJECT_TYPE_QUERY_POOL:                     return "query pool";
        case VK_OBJECT_TYPE_BUFFER_VIEW:                    return "buffer view";
        case VK_OBJECT_TYPE_IMAGE_VIEW:                     return "image view";
        case VK_OBJECT_TYPE_SHADER_MODULE:                  return "shader module";
        case VK_OBJECT_TYPE_PIPELINE_CACHE:                 return "pipeline cache";
        case VK_OBJECT_TYPE_PIPELINE_LAYOUT:                return "pipeline layout";
        case VK_OBJECT_TYPE_RENDER_PASS:                    return "render pass";
        case VK_OBJECT_TYPE_PIPELINE:                       return "pipeline";
        case VK_OBJECT_TYPE_DESCRIPTOR_SET_LAYOUT:          return "descriptor set layout";
        case VK_OBJECT_TYPE_SAMPLER:                        return "sampler";
        case VK_OBJECT_TYPE_DESCRIPTOR_POOL:                return "descriptor pool";
        case VK_OBJECT_TYPE_DESCRIPTOR_SET:                 return "descriptor set";
        case VK_OBJECT_TYPE_FRAMEBUFFER:                    return "framebuffer";
        case VK_OBJECT_TYPE_COMMAND_POOL:                   return "command pool";
        case VK_OBJECT_TYPE_SAMPLER_YCBCR_CONVERSION:       return "sampler ycbcr conversion";
        case VK_OBJECT_TYPE_DESCRIPTOR_UPDATE_TEMPLATE:     return "descriptor update template";
        case VK_OBJECT_TYPE_SURFACE_KHR:                    return "surface KHR";
        case VK_OBJECT_TYPE_SWAPCHAIN_KHR:                  return "swapchain KHR";
        case VK_OBJECT_TYPE_DISPLAY_KHR:                    return "display KHR";
        case VK_OBJECT_TYPE_DISPLAY_MODE_KHR:               return "display mode KHR";
        case VK_OBJECT_TYPE_DEBUG_REPORT_CALLBACK_EXT:      return "debug report callback";
        case VK_OBJECT_TYPE_DEBUG_UTILS_MESSENGER_EXT:      return "debug utils messenger";
        case VK_OBJECT_TYPE_ACCELERATION_STRUCTURE_KHR:     return "acceleration structure KHR";
        case VK_OBJECT_TYPE_VALIDATION_CACHE_EXT:           return "validation cache EXT";
        case VK_OBJECT_TYPE_PERFORMANCE_CONFIGURATION_INTEL:return "performance configuration INTEL";
        case VK_OBJECT_TYPE_DEFERRED_OPERATION_KHR:         return "deferred operation KHR";
        case VK_OBJECT_TYPE_INDIRECT_COMMANDS_LAYOUT_NV:    return "indirect commands layout NV";
        case VK_OBJECT_TYPE_PRIVATE_DATA_SLOT_EXT:          return "private data slot EXT";
        default: return "unknown";
            // clang-format on
    }
}